

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_iter.c
# Opt level: O0

int tnt_iter_reply_next(tnt_iter *i)

{
  int iVar1;
  int rc;
  tnt_iter_reply *ir;
  tnt_iter *i_local;
  
  tnt_reply_free(&(i->data).reply.r);
  tnt_reply_init(&(i->data).reply.r);
  iVar1 = (*((i->data).reply.s)->read_reply)
                    ((tnt_stream *)(i->data).array.data,(tnt_reply *)((long)&i->data + 8));
  if (iVar1 == -1) {
    i->status = TNT_ITER_FAIL;
    i_local._4_4_ = 0;
  }
  else {
    i_local._4_4_ = (uint)(iVar1 != 1);
  }
  return i_local._4_4_;
}

Assistant:

static int tnt_iter_reply_next(struct tnt_iter *i) {
	struct tnt_iter_reply *ir = TNT_IREPLY(i);
	tnt_reply_free(&ir->r);
	tnt_reply_init(&ir->r);
	int rc = ir->s->read_reply(ir->s, &ir->r);
	if (rc == -1) {
		i->status = TNT_ITER_FAIL;
		return 0;
	}
	return (rc == 1 /* finish */ ) ? 0 : 1;
}